

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trees.c
# Opt level: O3

void bi_windup(deflate_state *s)

{
  uint uVar1;
  Bytef BVar2;
  
  if (s->bi_valid < 9) {
    if (s->bi_valid < 1) goto LAB_008deab6;
    BVar2 = (Bytef)s->bi_buf;
  }
  else {
    uVar1 = s->pending;
    s->pending = uVar1 + 1;
    s->pending_buf[uVar1] = (Bytef)s->bi_buf;
    BVar2 = *(Bytef *)((long)&s->bi_buf + 1);
  }
  uVar1 = s->pending;
  s->pending = uVar1 + 1;
  s->pending_buf[uVar1] = BVar2;
LAB_008deab6:
  s->bi_buf = 0;
  s->bi_valid = 0;
  return;
}

Assistant:

local void bi_windup(deflate_state *s)
{
    if (s->bi_valid > 8) {
        put_short(s, s->bi_buf);
    } else if (s->bi_valid > 0) {
        put_byte(s, (Byte)s->bi_buf);
    }
    s->bi_buf = 0;
    s->bi_valid = 0;
#ifdef DEBUG
    s->bits_sent = (s->bits_sent+7) & ~7;
#endif
}